

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_flattening.cpp
# Opt level: O2

void __thiscall
ModelFlattening_importedComponentWithEquivalentVariables_Test::TestBody
          (ModelFlattening_importedComponentWithEquivalentVariables_Test *this)

{
  byte bVar1;
  char *pcVar2;
  allocator<char> local_131;
  string a;
  string aImportModel;
  string eImportModel;
  AssertionResult gtest_ar_1;
  ModelPtr model;
  string local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  PrinterPtr printer;
  ImporterPtr importer;
  string local_70 [32];
  ModelPtr importModel;
  ParserPtr parser;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"main_model\">\n  <component name=\"main_model_component\">\n    <variable name=\"v\" units=\"dimensionless\" initial_value=\"1\" interface=\"public_and_private\"/>\n  </component>\n  <component name=\"other_component\">\n    <variable name=\"time\" units=\"dimensionless\" interface=\"public\"/>\n    <variable name=\"parameter\" units=\"dimensionless\" interface=\"public\"/>\n    <variable name=\"cosine\" units=\"dimensionless\" initial_value=\"0\" interface=\"public\"/>\n    <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n      <apply>\n        <eq/>\n        <apply>\n          <diff/>\n          <bvar>\n            <ci>time</ci>\n          </bvar>\n          <ci>cosine</ci>\n        </apply>\n        <apply>\n          <sin/>\n          <apply>\n            <times/>\n            <ci>parameter</ci>\n            <ci>time</ci>\n          </apply>\n        </apply>\n      </apply>\n    </math>\n  </component>\n  <connection component_1=\"main_model_component\" component_2=\"other_component\">\n    <map_variables variable_1=\"v\" variable_2=\"parameter\"/>\n  </connection>\n  <encapsulation>\n    <component_ref component=\"main_model_component\">\n      <component_ref component=\"other_component\"/>\n    </component_ref>\n  </encapsulation>\n</model>\n"
             ,(allocator<char> *)&a);
  libcellml::Parser::create(SUB81(&parser,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&aImportModel,"modelflattening/equivalentimportedvariable.xml",
             (allocator<char> *)&eImportModel);
  fileContents((string *)&a);
  libcellml::Parser::parseModel((string *)&model);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::~string((string *)&aImportModel);
  libcellml::Importer::create(SUB81(&importer,0));
  aImportModel._M_dataplus._M_p._0_1_ = libcellml::Model::hasUnresolvedImports();
  aImportModel._M_string_length = 0;
  if ((byte)aImportModel._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&eImportModel);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&a,(char *)&aImportModel,"model->hasUnresolvedImports()","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x108,a._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&eImportModel)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&a);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&eImportModel);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&aImportModel._M_string_length);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&aImportModel,"modelflattening/",(allocator<char> *)&eImportModel);
  resourcePath((string *)&a);
  libcellml::Importer::resolveImports
            ((shared_ptr *)
             importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)&model);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::~string((string *)&aImportModel);
  bVar1 = libcellml::Model::hasUnresolvedImports();
  aImportModel._M_dataplus._M_p._0_1_ = bVar1 ^ 1;
  aImportModel._M_string_length = 0;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&eImportModel);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&a,(char *)&aImportModel,"model->hasUnresolvedImports()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x10c,a._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&eImportModel)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&a);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&eImportModel);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&aImportModel._M_string_length);
  libcellml::ComponentEntity::component((ulong)&eImportModel);
  libcellml::ComponentEntity::component((ulong)&aImportModel);
  libcellml::ImportedEntity::importSource();
  libcellml::ImportSource::model();
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&a._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&aImportModel._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&eImportModel._M_string_length);
  libcellml::Importer::flattenModel((shared_ptr *)&a);
  std::__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&a._M_string_length);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&a,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&aImportModel,"e","a",&e,&a);
  if ((byte)aImportModel._M_dataplus._M_p == 0) {
    testing::Message::Message((Message *)&eImportModel);
    if (aImportModel._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)aImportModel._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x116,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&eImportModel)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&eImportModel);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&aImportModel._M_string_length);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&aImportModel,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"modelflattening/reusable.xml",&local_131);
  fileContents((string *)&gtest_ar_1);
  libcellml::Parser::parseModel(local_a0);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&eImportModel,
             (bool)printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ._0_1_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string(local_70);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"eImportModel","aImportModel",&eImportModel,&aImportModel);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)local_70);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/model_flattening.cpp"
               ,0x11b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_70);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::__cxx11::string::~string((string *)&eImportModel);
  std::__cxx11::string::~string((string *)&aImportModel);
  std::__cxx11::string::~string((string *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importer.super___shared_ptr<libcellml::Importer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

TEST(ModelFlattening, importedComponentWithEquivalentVariables)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"main_model\">\n"
        "  <component name=\"main_model_component\">\n"
        "    <variable name=\"v\" units=\"dimensionless\" initial_value=\"1\" interface=\"public_and_private\"/>\n"
        "  </component>\n"
        "  <component name=\"other_component\">\n"
        "    <variable name=\"time\" units=\"dimensionless\" interface=\"public\"/>\n"
        "    <variable name=\"parameter\" units=\"dimensionless\" interface=\"public\"/>\n"
        "    <variable name=\"cosine\" units=\"dimensionless\" initial_value=\"0\" interface=\"public\"/>\n"
        "    <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "      <apply>\n"
        "        <eq/>\n"
        "        <apply>\n"
        "          <diff/>\n"
        "          <bvar>\n"
        "            <ci>time</ci>\n"
        "          </bvar>\n"
        "          <ci>cosine</ci>\n"
        "        </apply>\n"
        "        <apply>\n"
        "          <sin/>\n"
        "          <apply>\n"
        "            <times/>\n"
        "            <ci>parameter</ci>\n"
        "            <ci>time</ci>\n"
        "          </apply>\n"
        "        </apply>\n"
        "      </apply>\n"
        "    </math>\n"
        "  </component>\n"
        "  <connection component_1=\"main_model_component\" component_2=\"other_component\">\n"
        "    <map_variables variable_1=\"v\" variable_2=\"parameter\"/>\n"
        "  </connection>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"main_model_component\">\n"
        "      <component_ref component=\"other_component\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("modelflattening/equivalentimportedvariable.xml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());

    importer->resolveImports(model, resourcePath("modelflattening/"));

    EXPECT_FALSE(model->hasUnresolvedImports());

    // Want to make sure that we haven't damaged the import model after flattening.
    auto importModel = model->component(0)->component(0)->importSource()->model();

    model = importer->flattenModel(model);

    auto printer = libcellml::Printer::create();

    auto a = printer->printModel(model);
    EXPECT_EQ(e, a);

    // Check that we haven't changed the imported model.
    auto aImportModel = printer->printModel(importModel);
    auto eImportModel = printer->printModel(parser->parseModel(fileContents("modelflattening/reusable.xml")));
    EXPECT_EQ(eImportModel, aImportModel);
}